

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_generator.cc
# Opt level: O1

void webrtc::WindowGenerator::Hanning(int length,float *window)

{
  string *result;
  ostream *poVar1;
  ulong uVar2;
  float fVar3;
  int local_194;
  FatalMessage local_190;
  
  local_194 = 1;
  local_190._0_4_ = length;
  if (length < 2) {
    result = rtc::MakeCheckOpString<int,int>((int *)&local_190,&local_194,"length > 1");
  }
  else {
    result = (string *)0x0;
  }
  if (result == (string *)0x0) {
    if (window != (float *)0x0) {
      if (0 < length) {
        uVar2 = 0;
        do {
          fVar3 = cosf(((float)(int)uVar2 * 6.2831855) / (float)(length + -1));
          window[uVar2] = (1.0 - fVar3) * 0.5;
          uVar2 = uVar2 + 1;
        } while ((uint)length != uVar2);
      }
      return;
    }
    rtc::FatalMessage::FatalMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/window_generator.cc"
               ,0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190,"Check failed: window != nullptr",0x1f);
    std::ios::widen((char)(ostream *)&local_190 +
                    (char)*(undefined8 *)(CONCAT44(local_190._4_4_,local_190._0_4_) + -0x18));
    std::ostream::put((char)&local_190);
    poVar1 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"# ",2);
    rtc::FatalMessage::~FatalMessage(&local_190);
  }
  rtc::FatalMessage::FatalMessage
            (&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/window_generator.cc"
             ,0x29,result);
  rtc::FatalMessage::~FatalMessage(&local_190);
}

Assistant:

void WindowGenerator::Hanning(int length, float* window) {
  RTC_CHECK_GT(length, 1);
  RTC_CHECK(window != nullptr);
  for (int i = 0; i < length; ++i) {
    window[i] = 0.5f * (1 - cosf(2 * static_cast<float>(M_PI) * i /
                                 (length - 1)));
  }
}